

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void impute_missing_values_internal<float,long,long_double>
               (float *numeric_data,int *categ_data,bool is_col_major,float *Xr,long *Xr_ind,
               long *Xr_indptr,size_t nrows,int nthreads,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,Imputer *imputer)

{
  bool bVar1;
  ImputedData<long,_long_double> *prediction_data_00;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  ImputedData<long,_long_double> *in_RDI;
  undefined1 auVar6 [12];
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_stack_00000018;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_stack_00000020;
  ImputedData<long,_long_double> *in_stack_00000028;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *__range4_1;
  size_t row_1;
  double temp;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  iterator __end4;
  iterator __begin4;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *__range4;
  size_t row;
  exception_ptr ex;
  bool threw_exception;
  vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
  imp_memory;
  size_t end;
  size_t in_stack_00000198;
  double in_stack_000001a0;
  ImputedData<long,_long_double> *in_stack_000001a8;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_stack_000001b0;
  PredictionData<float,_long> *in_stack_000001b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  PredictionData<float,_long> prediction_data;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_stack_fffffffffffffd98;
  __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
  *in_stack_fffffffffffffda0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffda8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffdb0;
  exception_ptr this;
  size_type in_stack_fffffffffffffdb8;
  vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
  *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffe20;
  int nthreads_00;
  size_type __n;
  size_t *in_stack_fffffffffffffe28;
  Imputer *in_stack_fffffffffffffe30;
  PredictionData<float,_long> *in_stack_fffffffffffffe38;
  undefined1 *row_00;
  Imputer *imputer_00;
  ImputedData<long,_long_double> *imp;
  undefined1 local_178 [16];
  reference local_168;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *local_160;
  __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
  local_158 [2];
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  PredictionData<float,_long> *in_stack_fffffffffffffed0;
  ExtIsoForest *in_stack_fffffffffffffed8;
  __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
  in_stack_fffffffffffffee0;
  long *in_stack_fffffffffffffef0;
  ImputedData<long,_long_double> *pIVar7;
  exception_ptr in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  byte bVar8;
  undefined1 in_stack_ffffffffffffff07;
  vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_> local_f8;
  undefined4 local_dc;
  ImputedData<long,_long_double> *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  pointer in_stack_ffffffffffffff58;
  Imputer *in_stack_ffffffffffffff60;
  PredictionData<float,_long> *in_stack_ffffffffffffff68;
  
  nthreads_00 = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x58fc31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8,(allocator_type *)in_stack_fffffffffffffdb0._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x58fc5d);
  imputer_00 = (Imputer *)&stack0xffffffffffffff58;
  local_c8 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffd98);
  local_d0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffd98);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (unsigned_long)in_stack_fffffffffffffda0);
  imp = in_stack_00000028;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x58fcc5);
  prediction_data_00 =
       (ImputedData<long,_long_double> *)
       check_for_missing<PredictionData<float,long>>
                 (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                  nthreads_00);
  local_d8 = prediction_data_00;
  if (prediction_data_00 == (ImputedData<long,_long_double> *)0x0) {
    local_dc = 1;
  }
  else {
    row_00 = &stack0xffffffffffffff07;
    std::allocator<ImputedData<long,_long_double>_>::allocator
              ((allocator<ImputedData<long,_long_double>_> *)0x58fd8e);
    std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
    vector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
           (allocator_type *)in_stack_fffffffffffffdb0._M_current);
    std::allocator<ImputedData<long,_long_double>_>::~allocator
              ((allocator<ImputedData<long,_long_double>_> *)0x58fdb7);
    bVar8 = 0;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)&stack0xfffffffffffffef8,(nullptr_t)0x0);
    if (in_stack_00000018 ==
        (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
         *)0x0) {
      for (pIVar7 = (ImputedData<long,_long_double> *)0x0; pIVar7 < local_d8;
          pIVar7 = (ImputedData<long,_long_double> *)
                   ((long)&(pIVar7->num_sum).
                           super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
        if ((bVar8 & 1) == 0) {
          std::
          vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
          operator[](&local_f8,0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &stack0xffffffffffffff58,(size_type)pIVar7);
          initialize_impute_calc<ImputedData<long,long_double>,PredictionData<float,long>>
                    (in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     (size_t)in_stack_ffffffffffffff58);
          local_158[0]._M_current =
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
               std::
               vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ::begin(in_stack_fffffffffffffd98);
          local_160 = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                      std::
                      vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ::end(in_stack_fffffffffffffd98);
          while (bVar1 = __gnu_cxx::operator!=
                                   (in_stack_fffffffffffffda0,
                                    (__normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                                     *)in_stack_fffffffffffffd98), bVar1) {
            pvVar4 = __gnu_cxx::
                     __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                     ::operator*(local_158);
            local_168 = pvVar4;
            pvVar5 = std::
                     vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     ::operator[](in_stack_00000020,0);
            std::
            vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ::operator[]((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                          *)&(in_stack_00000028->num_weight).
                             super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                         ((long)pvVar4 - (long)pvVar5) / 0x18);
            std::
            vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
            ::operator[](&local_f8,0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &stack0xffffffffffffff58,(size_type)pIVar7);
            in_stack_fffffffffffffd98 =
                 (vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  *)0x0;
            in_stack_fffffffffffffda0 =
                 (__normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                  *)0x0;
            traverse_hplane<PredictionData<float,long>,long,ImputedData<long,long_double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       in_stack_fffffffffffffee0._M_current,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                       ,pIVar7,in_stack_fffffffffffffef0,
                       (double *)in_stack_fffffffffffffef8._M_exception_object,
                       CONCAT17(in_stack_ffffffffffffff07,CONCAT16(bVar8,in_stack_ffffffffffffff00))
                      );
            __gnu_cxx::
            __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
            ::operator++(local_158);
          }
          std::
          vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
          operator[](&local_f8,0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &stack0xffffffffffffff58,(size_type)pIVar7);
          apply_imputation_results<PredictionData<float,long>,ImputedData<long,long_double>>
                    ((PredictionData<float,_long> *)prediction_data_00,imp,imputer_00,(size_t)row_00
                    );
        }
      }
    }
    else {
      for (pIVar7 = (ImputedData<long,_long_double> *)0x0; pIVar7 < local_d8;
          pIVar7 = (ImputedData<long,_long_double> *)
                   ((long)&(pIVar7->num_sum).
                           super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
        if ((bVar8 & 1) == 0) {
          std::
          vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
          operator[](&local_f8,0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &stack0xffffffffffffff58,(size_type)pIVar7);
          initialize_impute_calc<ImputedData<long,long_double>,PredictionData<float,long>>
                    (in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     (size_t)in_stack_ffffffffffffff58);
          std::
          vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
          ::begin((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   *)in_stack_fffffffffffffd98);
          std::
          vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
          ::end((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)in_stack_fffffffffffffd98);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                                     *)in_stack_fffffffffffffda0,
                                    (__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                                     *)in_stack_fffffffffffffd98), bVar1) {
            pvVar2 = __gnu_cxx::
                     __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                     ::operator*((__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                                  *)&stack0xfffffffffffffee0);
            __n = 0;
            pvVar3 = std::
                     vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     ::operator[](in_stack_00000018,0);
            std::
            vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ::operator[]((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                          *)&(in_stack_00000028->num_weight).
                             super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                         ((long)pvVar2 - (long)pvVar3 >> 3) * -0x5555555555555555);
            std::
            vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
            ::operator[](&local_f8,__n);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &stack0xffffffffffffff58,(size_type)pIVar7);
            in_stack_fffffffffffffda0 =
                 (__normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                  *)0x0;
            in_stack_fffffffffffffd98 =
                 (vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  *)0x0;
            traverse_itree<PredictionData<float,long>,long,ImputedData<long,long_double>>
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       (IsoForest *)
                       ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,in_stack_000001b8,in_stack_000001b0,
                       in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
                       (long *)prediction_data.categ_data,(double *)prediction_data.nrows,
                       prediction_data._24_8_);
            __gnu_cxx::
            __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
            ::operator++((__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                          *)&stack0xfffffffffffffee0);
          }
          std::
          vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
          operator[](&local_f8,0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &stack0xffffffffffffff58,(size_type)pIVar7);
          apply_imputation_results<PredictionData<float,long>,ImputedData<long,long_double>>
                    ((PredictionData<float,_long> *)prediction_data_00,imp,imputer_00,(size_t)row_00
                    );
        }
      }
    }
    if ((bVar8 & 1) != 0) {
      this._M_exception_object = local_178;
      std::__exception_ptr::exception_ptr::exception_ptr
                ((exception_ptr *)in_stack_fffffffffffffda0,
                 (exception_ptr *)in_stack_fffffffffffffd98);
      auVar6 = std::rethrow_exception(this);
      local_bc = auVar6._8_4_;
      local_b8 = auVar6._0_8_;
      std::__exception_ptr::exception_ptr::~exception_ptr
                ((exception_ptr *)in_stack_fffffffffffffda0);
      std::__exception_ptr::exception_ptr::~exception_ptr
                ((exception_ptr *)in_stack_fffffffffffffda0);
      std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
      ::~vector((vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                 *)this._M_exception_object);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this._M_exception_object);
      _Unwind_Resume(local_b8);
    }
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_stack_fffffffffffffda0);
    std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
    ~vector((vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
             *)in_stack_fffffffffffffdb0._M_current);
    local_dc = 0;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffdb0._M_current);
  return;
}

Assistant:

void impute_missing_values_internal(
                           real_t numeric_data[], int categ_data[], bool is_col_major,
                           real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                           size_t nrows, int nthreads,
                           IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                           Imputer &imputer)
{
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, imputer.ncols_numeric, imputer.ncols_categ,
                                      NULL, NULL, NULL,
                                      Xr, Xr_ind, Xr_indptr};

    std::vector<size_t> ix_arr(nrows);
    std::iota(ix_arr.begin(), ix_arr.end(), (size_t) 0);

    size_t end = check_for_missing(prediction_data, imputer, ix_arr.data(), nthreads);

    if (end == 0)
        return;

    if ((size_t)nthreads > end)
        nthreads = (int)end;
    #ifdef _OPENMP
        std::vector<ImputedData<sparse_ix, ldouble_safe>> imp_memory(nthreads);
    #else
        std::vector<ImputedData<sparse_ix, ldouble_safe>> imp_memory(1);
    #endif

    bool threw_exception = false;
    std::exception_ptr ex = NULL;

    if (model_outputs != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(end, imp_memory, prediction_data, model_outputs, ix_arr, imputer, ex, threw_exception)
        for (size_t_for row = 0; row < (decltype(row))end; row++)
        {
            if (threw_exception) continue;
            try
            {
                initialize_impute_calc(imp_memory[omp_get_thread_num()], prediction_data, imputer, ix_arr[row]);

                for (std::vector<IsoTree> &tree : model_outputs->trees)
                {
                    traverse_itree(tree,
                                   *model_outputs,
                                   prediction_data,
                                   &imputer.imputer_tree[&tree - &(model_outputs->trees[0])],
                                   &imp_memory[omp_get_thread_num()],
                                   (double) 1,
                                   ix_arr[row],
                                   (sparse_ix*)NULL,
                                   (double*)NULL,
                                   (size_t) 0);
                }

                apply_imputation_results(prediction_data, imp_memory[omp_get_thread_num()], imputer, (size_t) ix_arr[row]);
            }

            catch(...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }

        }
    }

    else
    {
        double temp;
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(end, imp_memory, prediction_data, model_outputs_ext, ix_arr, imputer, ex, threw_exception) \
                private(temp)
        for (size_t_for row = 0; row < (decltype(row))end; row++)
        {
            if (threw_exception) continue;
            try
            {
                initialize_impute_calc(imp_memory[omp_get_thread_num()], prediction_data, imputer, ix_arr[row]);

                for (std::vector<IsoHPlane> &hplane : model_outputs_ext->hplanes)
                {
                    traverse_hplane(hplane,
                                    *model_outputs_ext,
                                    prediction_data,
                                    temp,
                                    &imputer.imputer_tree[&hplane - &(model_outputs_ext->hplanes[0])],
                                    &imp_memory[omp_get_thread_num()],
                                    (sparse_ix*)NULL,
                                    (double*)NULL,
                                    ix_arr[row]);
                }

                apply_imputation_results(prediction_data, imp_memory[omp_get_thread_num()], imputer, (size_t) ix_arr[row]);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }

        }
    }

    if (threw_exception)
        std::rethrow_exception(ex);
}